

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  ushort *puVar6;
  float *pfVar7;
  long lVar8;
  float fVar9;
  
  bVar3 = (k->res).ulog2;
  if (k->vw << (bVar3 & 0x1f) != 0) {
    puVar6 = (ushort *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 2);
    puVar1 = puVar6 + (k->vw << (bVar3 & 0x1f));
    pfVar5 = k->ku;
    pfVar7 = k->kv;
    iVar4 = k->uw;
    do {
      fVar9 = (float)*puVar6 * *pfVar5;
      if (iVar4 != 1) {
        lVar8 = 0;
        do {
          fVar9 = fVar9 + (float)*(ushort *)((long)puVar6 + lVar8 + 2) *
                          *(float *)((long)pfVar5 + lVar8 * 2 + 4);
          lVar8 = lVar8 + 2;
        } while ((long)iVar4 * 2 + -2 != lVar8);
        puVar6 = (ushort *)((long)puVar6 + lVar8);
      }
      fVar2 = *pfVar7;
      pfVar7 = pfVar7 + 1;
      *result = fVar9 * fVar2 + *result;
      puVar6 = puVar6 + (long)((1 << (bVar3 & 0x1f)) - iVar4) + 1;
    } while (puVar6 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }